

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleDefaultDecayTimeDirective(Preprocessor *this,Token directive)

{
  Token *pTVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  Info *pIVar4;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  Token TVar14;
  uint uVar15;
  DefaultDecayTimeDirectiveSyntax *syntax;
  Token TVar16;
  string_view sVar17;
  Token local_68;
  Token local_58;
  Token local_48;
  Trivia local_38;
  
  local_58.info = directive.info;
  local_58._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_68);
  pTVar1 = &this->currentToken;
  pIVar4 = (this->currentToken).info;
  if (pIVar4 == (Info *)0x0) {
    TVar16 = nextProcessed(this);
    this->currentToken = TVar16;
  }
  else {
    uVar2 = pTVar1->kind;
    uVar5 = pTVar1->field_0x2;
    uVar7 = pTVar1->numFlags;
    uVar9 = pTVar1->rawLen;
    TVar16.rawLen = uVar9;
    TVar16.numFlags.raw = uVar7;
    TVar16._2_1_ = uVar5;
    TVar16.kind = uVar2;
    TVar16.info = pIVar4;
  }
  if (TVar16.kind == Identifier) {
    if (TVar16.info == (Info *)0x0) {
      TVar16 = nextProcessed(this);
      this->currentToken = TVar16;
    }
    local_48 = TVar16;
    sVar17 = Token::valueText(&local_48);
    if ((sVar17._M_len != 8) || (*(long *)sVar17._M_str != 0x6574696e69666e69)) goto LAB_001fddd2;
    pIVar4 = (this->currentToken).info;
    if (pIVar4 == (Info *)0x0) goto LAB_001fdd8a;
    uVar3 = pTVar1->kind;
    uVar6 = pTVar1->field_0x2;
    uVar8 = pTVar1->numFlags;
    uVar10 = pTVar1->rawLen;
    TVar16.rawLen = uVar10;
    TVar16.numFlags.raw = uVar8;
    TVar16._2_1_ = uVar6;
    TVar16.kind = uVar3;
    TVar16.info = pIVar4;
  }
  else {
    uVar15 = TVar16._0_4_ & 0xffff;
    if ((uVar15 != 8) && (uVar15 != 5)) goto LAB_001fddd2;
    if (TVar16.info == (Info *)0x0) {
LAB_001fdd8a:
      TVar16 = nextProcessed(this);
      this->currentToken = TVar16;
    }
  }
  uVar11 = pTVar1->field_0x2;
  NVar12.raw = (pTVar1->numFlags).raw;
  uVar13 = pTVar1->rawLen;
  pIVar4 = (this->currentToken).info;
  (this->lastConsumed).kind = pTVar1->kind;
  (this->lastConsumed).field_0x2 = uVar11;
  (this->lastConsumed).numFlags = (NumericTokenFlags)NVar12.raw;
  (this->lastConsumed).rawLen = uVar13;
  (this->lastConsumed).info = pIVar4;
  Token::Token(&local_48);
  TVar14 = local_48;
  pTVar1->kind = local_48.kind;
  pTVar1->field_0x2 = local_48._2_1_;
  pTVar1->numFlags = (NumericTokenFlags)local_48.numFlags.raw;
  pTVar1->rawLen = local_48.rawLen;
  (this->currentToken).info = local_48.info;
  local_68 = TVar16;
  local_48 = TVar14;
LAB_001fddd2:
  if (local_68.info == (Info *)0x0) {
    local_68 = expect(this,IntegerLiteral);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::DefaultDecayTimeDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_58,&local_68);
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
}

Assistant:

Trivia Preprocessor::handleDefaultDecayTimeDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token time;
    switch (peek().kind) {
        case TokenKind::IntegerLiteral:
        case TokenKind::RealLiteral:
            time = consume();
            break;
        case TokenKind::Identifier:
            if (peek().valueText() == "infinite")
                time = consume();
            break;
        default:
            break;
    }

    if (!time)
        time = expect(TokenKind::IntegerLiteral);

    auto result = alloc.emplace<DefaultDecayTimeDirectiveSyntax>(directive, time);
    return Trivia(TriviaKind::Directive, result);
}